

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_strutil.cpp
# Opt level: O0

int test_strutil_trimcustom(ITesting *t)

{
  bool bVar1;
  int iVar2;
  string *__str;
  allocator<char> local_71;
  kTRContinueMode tr_temp_res;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string str;
  ITesting *t_local;
  
  str.field_2._8_8_ = t;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"   \"dump\"  ",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&tr_temp_res," \"\n",&local_71);
  __str = trun::trim((string *)local_38,(string *)&tr_temp_res);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,__str);
  std::__cxx11::string::~string((string *)&tr_temp_res);
  std::allocator<char>::~allocator(&local_71);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"dump");
  if ((bVar1) ||
     (iVar2 = (**(code **)(str.field_2._8_8_ + 0x30))
                        (0x3e,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_strutil.cpp"
                         ,"str == \"dump\""), iVar2 != 0)) {
    t_local._4_4_ = 0;
  }
  else {
    t_local._4_4_ = 0x10;
  }
  std::__cxx11::string::~string((string *)local_38);
  return t_local._4_4_;
}

Assistant:

DLL_EXPORT int test_strutil_trimcustom(ITesting *t) {
    std::string str("   \"dump\"  ");
    str = trun::trim(str, " \"\n");
    TR_ASSERT(t,str == "dump");
    return kTR_Pass;
}